

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O3

void __thiscall capnp::compiler::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  BrandScope *pBVar6;
  SegmentReader *pSVar7;
  CapTableReader *pCVar8;
  void *pvVar9;
  WirePointer *pWVar10;
  StructPointerCount SVar11;
  undefined2 uVar12;
  int iVar13;
  undefined4 uVar14;
  byte bVar15;
  uint uVar16;
  
  uVar16 = (other->body).tag;
  (this->body).tag = uVar16;
  if (uVar16 == 1) {
    *(undefined8 *)((long)&(this->body).field_1 + 0x20) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x20);
    uVar1 = *(undefined8 *)&(other->body).field_1;
    uVar2 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    uVar3 = *(undefined8 *)((long)&(other->body).field_1 + 0x18);
    *(undefined8 *)((long)&(this->body).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x10);
    *(undefined8 *)((long)&(this->body).field_1 + 0x18) = uVar3;
    *(undefined8 *)&(this->body).field_1 = uVar1;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar2;
    bVar15 = (other->body).field_1.space[0x28];
    (this->body).field_1.space[0x28] = bVar15;
    if (bVar15 == 1) {
      uVar1 = *(undefined8 *)((long)&(other->body).field_1 + 0x30);
      uVar2 = *(undefined8 *)((long)&(other->body).field_1 + 0x38);
      uVar3 = *(undefined8 *)((long)&(other->body).field_1 + 0x40);
      uVar4 = *(undefined8 *)((long)&(other->body).field_1 + 0x48);
      uVar5 = *(undefined8 *)((long)&(other->body).field_1 + 0x58);
      *(undefined8 *)((long)&(this->body).field_1 + 0x50) =
           *(undefined8 *)((long)&(other->body).field_1 + 0x50);
      *(undefined8 *)((long)&(this->body).field_1 + 0x58) = uVar5;
      *(undefined8 *)((long)&(this->body).field_1 + 0x40) = uVar3;
      *(undefined8 *)((long)&(this->body).field_1 + 0x48) = uVar4;
      *(undefined8 *)((long)&(this->body).field_1 + 0x30) = uVar1;
      *(undefined8 *)((long)&(this->body).field_1 + 0x38) = uVar2;
      bVar15 = (other->body).field_1.space[0x28];
    }
    if ((bVar15 & 1) != 0) {
      (other->body).field_1.space[0x28] = '\0';
    }
    uVar16 = (other->body).tag;
  }
  if (uVar16 == 2) {
    uVar1 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    *(undefined8 *)&(this->body).field_1 = *(undefined8 *)&(other->body).field_1;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar1;
  }
  pBVar6 = (other->brand).ptr;
  (this->brand).disposer = (other->brand).disposer;
  (this->brand).ptr = pBVar6;
  (other->brand).ptr = (BrandScope *)0x0;
  pSVar7 = (other->source)._reader.segment;
  pCVar8 = (other->source)._reader.capTable;
  pvVar9 = (other->source)._reader.data;
  pWVar10 = (other->source)._reader.pointers;
  SVar11 = (other->source)._reader.pointerCount;
  uVar12 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar13 = (other->source)._reader.nestingLimit;
  uVar14 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  (this->source)._reader.dataSize = (other->source)._reader.dataSize;
  (this->source)._reader.pointerCount = SVar11;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar12;
  (this->source)._reader.nestingLimit = iVar13;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar14;
  (this->source)._reader.data = pvVar9;
  (this->source)._reader.pointers = pWVar10;
  (this->source)._reader.segment = pSVar7;
  (this->source)._reader.capTable = pCVar8;
  return;
}

Assistant:

void moveFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(moveVariantFrom<Variants>(other)...);
  }